

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatrix.cpp
# Opt level: O1

void __thiscall Bmatrix::clear(Bmatrix *this)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer this_00;
  
  pvVar1 = (this->B).
           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->B).
           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar1;
  if (pvVar2 != pvVar1) {
    do {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar2);
    (this->B).
    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  }
  this->zNum = 0;
  this->xNum = 0;
  this->yNum = 0;
  return;
}

Assistant:

void Bmatrix::clear() {
    B.clear();
    xNum = yNum = zNum = 0;
}